

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcZone,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcZone *in;
  
  in = (IfcZone *)operator_new(0x108);
  *(undefined ***)&(in->super_IfcGroup).field_0xf0 = &PTR__Object_008048a0;
  *(undefined8 *)&in->field_0xf8 = 0;
  *(char **)&in->field_0x100 = "IfcZone";
  Assimp::IFC::Schema_2x3::IfcGroup::IfcGroup((IfcGroup *)in,&PTR_construction_vtable_24__0088d958);
  *(undefined ***)&(in->super_IfcGroup).super_IfcObject = &PTR__IfcZone_0088d878;
  *(undefined ***)&(in->super_IfcGroup).field_0xf0 = &PTR__IfcZone_0088d940;
  *(undefined ***)&(in->super_IfcGroup).super_IfcObject.field_0x88 = &PTR__IfcZone_0088d8a0;
  (in->super_IfcGroup).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcZone_0088d8c8;
  *(undefined ***)&(in->super_IfcGroup).super_IfcObject.field_0xd0 = &PTR__IfcZone_0088d8f0;
  *(undefined ***)&(in->super_IfcGroup).super_IfcObject.field_0xe0 = &PTR__IfcZone_0088d918;
  GenericFill<Assimp::IFC::Schema_2x3::IfcZone>(db,params,in);
  return (Object *)
         (&(in->super_IfcGroup).super_IfcObject.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcGroup).super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }